

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O3

void __thiscall
QtMWidgets::DateTimePicker::DateTimePicker(DateTimePicker *this,QDateTime *dt,QWidget *parent)

{
  Scroller *pSVar1;
  char cVar2;
  DateTimePickerPrivate *this_00;
  undefined4 *puVar3;
  code *local_70;
  undefined8 local_68;
  code *local_60;
  ImplFn local_58;
  QTime local_4c;
  QObject local_48 [8];
  QObject local_40 [8];
  QObject local_38 [8];
  QDate local_30;
  
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_00191658;
  *(undefined ***)&this->field_0x10 = &PTR__DateTimePicker_00191808;
  this_00 = (DateTimePickerPrivate *)operator_new(0xa8);
  DateTimePickerPrivate::DateTimePickerPrivate(this_00,this,QDateTime);
  (this->d).d = this_00;
  QWidget::setSizePolicy((QSizePolicy)SUB84(this,0));
  cVar2 = QDateTime::isValid();
  if (cVar2 == '\0') {
    QDate::QDate(&local_30,100,1,1);
    QTime::QTime(&local_4c,0,0,0,0);
    QDateTime::QDateTime((QDateTime *)&local_70,local_30,local_4c,LocalTime,0);
  }
  else {
    QDateTime::QDateTime((QDateTime *)&local_70,dt);
  }
  setDateTime(this,(QDateTime *)&local_70);
  QDateTime::~QDateTime((QDateTime *)&local_70);
  pSVar1 = ((this->d).d)->scroller;
  local_70 = Scroller::aboutToStart;
  local_68 = 0;
  local_60 = _q_scrollAboutToStart;
  local_58 = (ImplFn)0x0;
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::QSlotObject<void_(QtMWidgets::DateTimePicker::*)(),_QtPrivate::List<>,_void>::impl
  ;
  *(code **)(puVar3 + 4) = _q_scrollAboutToStart;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_38,(void **)pSVar1,(QObject *)&local_70,(void **)this,
             (QSlotObjectBase *)&local_60,(ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  pSVar1 = ((this->d).d)->scroller;
  local_70 = Scroller::scroll;
  local_68 = 0;
  local_60 = _q_scroll;
  local_58 = (ImplFn)0x0;
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QSlotObject<void_(QtMWidgets::DateTimePicker::*)(int,_int),_QtPrivate::List<int,_int>,_void>
       ::impl;
  *(code **)(puVar3 + 4) = _q_scroll;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_40,(void **)pSVar1,(QObject *)&local_70,(void **)this,
             (QSlotObjectBase *)&local_60,(ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  pSVar1 = ((this->d).d)->scroller;
  local_70 = Scroller::finished;
  local_68 = 0;
  local_60 = _q_scrollFinished;
  local_58 = (ImplFn)0x0;
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::QSlotObject<void_(QtMWidgets::DateTimePicker::*)(),_QtPrivate::List<>,_void>::impl
  ;
  *(code **)(puVar3 + 4) = _q_scrollFinished;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_48,(void **)pSVar1,(QObject *)&local_70,(void **)this,
             (QSlotObjectBase *)&local_60,(ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  return;
}

Assistant:

DateTimePicker::DateTimePicker( const QDateTime & dt, QWidget * parent )
	:	QWidget( parent )
	,	d( new DateTimePickerPrivate( this, QMetaType::QDateTime ) )
{
	setSizePolicy( QSizePolicy( QSizePolicy::Fixed,
		QSizePolicy::Fixed ) );

	setDateTime( dt.isValid() ? dt : DATETIMEPICKER_DATETIME_MIN );

	connect( d->scroller, &Scroller::aboutToStart,
		this, &DateTimePicker::_q_scrollAboutToStart );

	connect( d->scroller, &Scroller::scroll,
		this, &DateTimePicker::_q_scroll );

	connect( d->scroller, &Scroller::finished,
		this, &DateTimePicker::_q_scrollFinished );
}